

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::SliderBehaviorT<unsigned_int,int,float>
               (ImRect *bb,ImGuiID id,ImGuiDataType data_type,uint *v,uint v_min,uint v_max,
               char *format,ImGuiSliderFlags flags,ImRect *out_grab_bb)

{
  ImVec2 IVar1;
  float fVar2;
  undefined1 auVar3 [16];
  undefined8 uVar4;
  undefined1 auVar5 [16];
  int iVar6;
  ImGuiContext *pIVar7;
  int iVar8;
  ImGuiContext *g;
  uint uVar9;
  bool bVar10;
  uint uVar11;
  bool bVar12;
  float fVar13;
  float t;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  float fVar16;
  float fVar17;
  float fVar18;
  undefined1 auVar19 [64];
  float fVar20;
  float fVar21;
  float zero_deadzone_halfsize;
  undefined1 extraout_var [56];
  
  pIVar7 = GImGui;
  iVar6 = v_min - v_max;
  if (v_min < v_max) {
    iVar6 = -(v_min - v_max);
  }
  uVar9 = data_type & 0xfffffffe;
  uVar11 = flags & 0x100000;
  fVar17 = *(float *)((long)&(bb->Max).x + (ulong)(uVar11 >> 0x12));
  fVar21 = *(float *)((long)&(bb->Min).x + (ulong)(uVar11 >> 0x12));
  fVar2 = (fVar17 - fVar21) + -4.0;
  fVar13 = (GImGui->Style).GrabMinSize;
  if (-1 < iVar6 && uVar9 != 8) {
    fVar20 = fVar2 / (float)(iVar6 + 1);
    uVar4 = vcmpss_avx512f(ZEXT416((uint)fVar13),ZEXT416((uint)fVar20),2);
    bVar10 = (bool)((byte)uVar4 & 1);
    fVar13 = (float)((uint)bVar10 * (int)fVar20 + (uint)!bVar10 * (int)fVar13);
  }
  auVar3 = vminss_avx(ZEXT416((uint)fVar13),ZEXT416((uint)fVar2));
  zero_deadzone_halfsize = 0.0;
  fVar20 = 0.0;
  fVar13 = fVar2 - auVar3._0_4_;
  if ((flags & 0x20U) != 0) {
    if (uVar9 == 8) {
      iVar8 = ImParseFormatPrecision(format,3);
      fVar20 = (float)iVar8;
    }
    else {
      fVar20 = 1.0;
    }
    fVar20 = powf(0.1,fVar20);
    auVar14 = vmaxss_avx(ZEXT416((uint)fVar13),ZEXT416(0x3f800000));
    zero_deadzone_halfsize = ((pIVar7->Style).LogSliderDeadzone * 0.5) / auVar14._0_4_;
  }
  auVar14 = vfmadd231ss_fma(ZEXT416((uint)(fVar21 + 2.0)),auVar3,SUB6416(ZEXT464(0x3f000000),0));
  fVar21 = auVar14._0_4_;
  if (pIVar7->ActiveId == id) {
    if (pIVar7->ActiveIdSource == ImGuiInputSource_Nav) {
      if (pIVar7->ActiveIdIsJustActivated == true) {
        pIVar7->SliderCurrentAccum = 0.0;
        pIVar7->SliderCurrentAccumDirty = false;
      }
      auVar19._0_8_ = GetNavInputAmount2d(6,ImGuiInputReadMode_RepeatFast,0.0,0.0);
      auVar19._8_56_ = extraout_var;
      auVar14 = vmovshdup_avx(auVar19._0_16_);
      auVar15._8_4_ = 0x80000000;
      auVar15._0_8_ = 0x8000000080000000;
      auVar15._12_4_ = 0x80000000;
      auVar14 = vxorps_avx512vl(auVar14,auVar15);
      auVar14._0_4_ =
           (float)((uint)(uVar11 == 0) * (int)auVar19._0_4_ + (uint)(uVar11 != 0) * auVar14._0_4_);
      if ((auVar14._0_4_ != 0.0) || (NAN(auVar14._0_4_))) {
        if ((uVar9 == 8) && (iVar8 = ImParseFormatPrecision(format,3), 0 < iVar8)) {
          uVar4 = vcmpss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)(GImGui->IO).NavInputs[0xe]),1);
          bVar10 = (bool)((byte)uVar4 & 1);
          fVar13 = (float)((uint)bVar10 * (int)((auVar14._0_4_ / 100.0) / 10.0) +
                          (uint)!bVar10 * (int)(auVar14._0_4_ / 100.0));
        }
        else if ((iVar6 + 100U < 0xc9) || (0.0 < (GImGui->IO).NavInputs[0xe])) {
          uVar4 = vcmpss_avx512f(auVar14,ZEXT816(0) << 0x40,1);
          bVar10 = (bool)((byte)uVar4 & 1);
          fVar13 = (float)((uint)bVar10 * -0x40800000 + (uint)!bVar10 * 0x3f800000) / (float)iVar6;
        }
        else {
          fVar13 = auVar14._0_4_ / 100.0;
        }
        uVar4 = vcmpss_avx512f(ZEXT816(0) << 0x40,ZEXT416((uint)(GImGui->IO).NavInputs[0xf]),1);
        bVar10 = (bool)((byte)uVar4 & 1);
        fVar13 = (float)((uint)bVar10 * (int)(fVar13 * 10.0) + (uint)!bVar10 * (int)fVar13) +
                 pIVar7->SliderCurrentAccum;
        pIVar7->SliderCurrentAccum = fVar13;
        pIVar7->SliderCurrentAccumDirty = true;
      }
      else {
        fVar13 = pIVar7->SliderCurrentAccum;
      }
      if ((pIVar7->NavActivatePressedId == id) && (pIVar7->ActiveIdIsJustActivated == false)) {
        ClearActiveID();
      }
      else if (pIVar7->SliderCurrentAccumDirty == true) {
        bVar10 = SUB41((flags & 0x20U) >> 5,0);
        fVar16 = ScaleRatioFromValueT<unsigned_int,int,float>
                           (data_type,*v,v_min,v_max,bVar10,fVar20,zero_deadzone_halfsize);
        if (((fVar16 < 1.0) || (fVar13 <= 0.0)) && ((0.0 < fVar16 || (0.0 <= fVar13)))) {
          uVar4 = vcmpss_avx512f(ZEXT416((uint)(fVar13 + fVar16)),ZEXT816(0) << 0x40,1);
          auVar14 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)(fVar13 + fVar16)));
          t = (float)((uint)!(bool)((byte)uVar4 & 1) * auVar14._0_4_);
          uVar9 = ScaleValueFromRatioT<unsigned_int,int,float>
                            (data_type,t,v_min,v_max,bVar10,fVar20,zero_deadzone_halfsize);
          if ((flags & 0x40U) == 0) {
            uVar9 = RoundScalarWithFormatT<unsigned_int,int>(format,data_type,uVar9);
          }
          fVar18 = ScaleRatioFromValueT<unsigned_int,int,float>
                             (data_type,uVar9,v_min,v_max,bVar10,fVar20,zero_deadzone_halfsize);
          fVar18 = fVar18 - fVar16;
          bVar10 = fVar13 <= fVar18;
          if (0.0 < fVar13) {
            bVar10 = fVar18 < fVar13;
          }
          pIVar7->SliderCurrentAccum =
               pIVar7->SliderCurrentAccum -
               (float)((uint)bVar10 * (int)fVar18 + (uint)!bVar10 * (int)fVar13);
          pIVar7->SliderCurrentAccumDirty = false;
          goto LAB_002965b8;
        }
        pIVar7->SliderCurrentAccum = 0.0;
        pIVar7->SliderCurrentAccumDirty = false;
      }
    }
    else if (pIVar7->ActiveIdSource == ImGuiInputSource_Mouse) {
      if ((pIVar7->IO).MouseDown[0] == false) {
        ClearActiveID();
      }
      else {
        fVar16 = 0.0;
        if (0.0 < fVar13) {
          auVar15 = ZEXT416((uint)((*(float *)((pIVar7->IO).MouseDown +
                                              (ulong)(uVar11 >> 0x14) * 4 + -8) - fVar21) / fVar13))
          ;
          auVar14 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar15);
          uVar4 = vcmpss_avx512f(auVar15,ZEXT816(0),1);
          fVar16 = (float)((uint)!(bool)((byte)uVar4 & 1) * auVar14._0_4_);
        }
        t = (float)((uint)(uVar11 == 0) * (int)fVar16 + (uint)(uVar11 != 0) * (int)(1.0 - fVar16));
LAB_002965b8:
        uVar9 = ScaleValueFromRatioT<unsigned_int,int,float>
                          (data_type,t,v_min,v_max,SUB41((flags & 0x20U) >> 5,0),fVar20,
                           zero_deadzone_halfsize);
        if ((flags & 0x40U) == 0) {
          uVar9 = RoundScalarWithFormatT<unsigned_int,int>(format,data_type,uVar9);
        }
        if (*v != uVar9) {
          *v = uVar9;
          bVar10 = true;
          goto LAB_00296920;
        }
      }
    }
  }
  bVar10 = false;
LAB_00296920:
  if (1.0 <= fVar2) {
    auVar5._8_4_ = 0x80000000;
    auVar5._0_8_ = 0x8000000080000000;
    auVar5._12_4_ = 0x80000000;
    auVar15 = vxorps_avx512vl(auVar3,auVar5);
    auVar14 = vfnmadd231ss_fma(ZEXT416((uint)(fVar17 + -2.0)),auVar3,SUB6416(ZEXT464(0x3f000000),0))
    ;
    fVar17 = ScaleRatioFromValueT<unsigned_int,int,float>
                       (data_type,*v,v_min,v_max,SUB41((flags & 0x20U) >> 5,0),fVar20,
                        zero_deadzone_halfsize);
    bVar12 = uVar11 == 0;
    auVar14 = vfmadd213ss_fma(ZEXT416((uint)(auVar14._0_4_ - fVar21)),
                              ZEXT416((uint)bVar12 * (int)fVar17 +
                                      (uint)!bVar12 * (int)(1.0 - fVar17)),ZEXT416((uint)fVar21));
    if (bVar12) {
      fVar17 = (bb->Min).y;
      fVar21 = (bb->Max).y;
      auVar15 = vfmadd213ss_fma(auVar15,SUB6416(ZEXT464(0x3f000000),0),auVar14);
      auVar3 = vfmadd213ss_fma(auVar3,SUB6416(ZEXT464(0x3f000000),0),auVar14);
      (out_grab_bb->Min).x = auVar15._0_4_;
      (out_grab_bb->Min).y = fVar17 + 2.0;
      (out_grab_bb->Max).x = auVar3._0_4_;
      (out_grab_bb->Max).y = fVar21 + -2.0;
    }
    else {
      fVar17 = (bb->Max).x;
      auVar15 = vfmadd213ss_fma(auVar15,SUB6416(ZEXT464(0x3f000000),0),auVar14);
      auVar3 = vfmadd213ss_fma(auVar3,SUB6416(ZEXT464(0x3f000000),0),auVar14);
      (out_grab_bb->Min).x = (bb->Min).x + 2.0;
      (out_grab_bb->Min).y = auVar15._0_4_;
      (out_grab_bb->Max).x = fVar17 + -2.0;
      (out_grab_bb->Max).y = auVar3._0_4_;
    }
  }
  else {
    IVar1 = bb->Min;
    out_grab_bb->Min = IVar1;
    out_grab_bb->Max = IVar1;
  }
  return bVar10;
}

Assistant:

bool ImGui::SliderBehaviorT(const ImRect& bb, ImGuiID id, ImGuiDataType data_type, TYPE* v, const TYPE v_min, const TYPE v_max, const char* format, ImGuiSliderFlags flags, ImRect* out_grab_bb)
{
    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;

    const ImGuiAxis axis = (flags & ImGuiSliderFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_logarithmic = (flags & ImGuiSliderFlags_Logarithmic) != 0;
    const bool is_floating_point = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);

    const float grab_padding = 2.0f;
    const float slider_sz = (bb.Max[axis] - bb.Min[axis]) - grab_padding * 2.0f;
    float grab_sz = style.GrabMinSize;
    SIGNEDTYPE v_range = (v_min < v_max ? v_max - v_min : v_min - v_max);
    if (!is_floating_point && v_range >= 0)                                             // v_range < 0 may happen on integer overflows
        grab_sz = ImMax((float)(slider_sz / (v_range + 1)), style.GrabMinSize);  // For integer sliders: if possible have the grab size represent 1 unit
    grab_sz = ImMin(grab_sz, slider_sz);
    const float slider_usable_sz = slider_sz - grab_sz;
    const float slider_usable_pos_min = bb.Min[axis] + grab_padding + grab_sz * 0.5f;
    const float slider_usable_pos_max = bb.Max[axis] - grab_padding - grab_sz * 0.5f;

    float logarithmic_zero_epsilon = 0.0f; // Only valid when is_logarithmic is true
    float zero_deadzone_halfsize = 0.0f; // Only valid when is_logarithmic is true
    if (is_logarithmic)
    {
        // When using logarithmic sliders, we need to clamp to avoid hitting zero, but our choice of clamp value greatly affects slider precision. We attempt to use the specified precision to estimate a good lower bound.
        const int decimal_precision = is_floating_point ? ImParseFormatPrecision(format, 3) : 1;
        logarithmic_zero_epsilon = ImPow(0.1f, (float)decimal_precision);
        zero_deadzone_halfsize = (style.LogSliderDeadzone * 0.5f) / ImMax(slider_usable_sz, 1.0f);
    }

    // Process interacting with the slider
    bool value_changed = false;
    if (g.ActiveId == id)
    {
        bool set_new_value = false;
        float clicked_t = 0.0f;
        if (g.ActiveIdSource == ImGuiInputSource_Mouse)
        {
            if (!g.IO.MouseDown[0])
            {
                ClearActiveID();
            }
            else
            {
                const float mouse_abs_pos = g.IO.MousePos[axis];
                clicked_t = (slider_usable_sz > 0.0f) ? ImClamp((mouse_abs_pos - slider_usable_pos_min) / slider_usable_sz, 0.0f, 1.0f) : 0.0f;
                if (axis == ImGuiAxis_Y)
                    clicked_t = 1.0f - clicked_t;
                set_new_value = true;
            }
        }
        else if (g.ActiveIdSource == ImGuiInputSource_Nav)
        {
            if (g.ActiveIdIsJustActivated)
            {
                g.SliderCurrentAccum = 0.0f; // Reset any stored nav delta upon activation
                g.SliderCurrentAccumDirty = false;
            }

            const ImVec2 input_delta2 = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 0.0f, 0.0f);
            float input_delta = (axis == ImGuiAxis_X) ? input_delta2.x : -input_delta2.y;
            if (input_delta != 0.0f)
            {
                const int decimal_precision = is_floating_point ? ImParseFormatPrecision(format, 3) : 0;
                if (decimal_precision > 0)
                {
                    input_delta /= 100.0f;    // Gamepad/keyboard tweak speeds in % of slider bounds
                    if (IsNavInputDown(ImGuiNavInput_TweakSlow))
                        input_delta /= 10.0f;
                }
                else
                {
                    if ((v_range >= -100.0f && v_range <= 100.0f) || IsNavInputDown(ImGuiNavInput_TweakSlow))
                        input_delta = ((input_delta < 0.0f) ? -1.0f : +1.0f) / (float)v_range; // Gamepad/keyboard tweak speeds in integer steps
                    else
                        input_delta /= 100.0f;
                }
                if (IsNavInputDown(ImGuiNavInput_TweakFast))
                    input_delta *= 10.0f;

                g.SliderCurrentAccum += input_delta;
                g.SliderCurrentAccumDirty = true;
            }

            float delta = g.SliderCurrentAccum;
            if (g.NavActivatePressedId == id && !g.ActiveIdIsJustActivated)
            {
                ClearActiveID();
            }
            else if (g.SliderCurrentAccumDirty)
            {
                clicked_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, *v, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

                if ((clicked_t >= 1.0f && delta > 0.0f) || (clicked_t <= 0.0f && delta < 0.0f)) // This is to avoid applying the saturation when already past the limits
                {
                    set_new_value = false;
                    g.SliderCurrentAccum = 0.0f; // If pushing up against the limits, don't continue to accumulate
                }
                else
                {
                    set_new_value = true;
                    float old_clicked_t = clicked_t;
                    clicked_t = ImSaturate(clicked_t + delta);

                    // Calculate what our "new" clicked_t will be, and thus how far we actually moved the slider, and subtract this from the accumulator
                    TYPE v_new = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, clicked_t, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
                    if (!(flags & ImGuiSliderFlags_NoRoundToFormat))
                        v_new = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_new);
                    float new_clicked_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_new, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

                    if (delta > 0)
                        g.SliderCurrentAccum -= ImMin(new_clicked_t - old_clicked_t, delta);
                    else
                        g.SliderCurrentAccum -= ImMax(new_clicked_t - old_clicked_t, delta);
                }

                g.SliderCurrentAccumDirty = false;
            }
        }

        if (set_new_value)
        {
            TYPE v_new = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, clicked_t, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

            // Round to user desired precision based on format string
            if (!(flags & ImGuiSliderFlags_NoRoundToFormat))
                v_new = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_new);

            // Apply result
            if (*v != v_new)
            {
                *v = v_new;
                value_changed = true;
            }
        }
    }

    if (slider_sz < 1.0f)
    {
        *out_grab_bb = ImRect(bb.Min, bb.Min);
    }
    else
    {
        // Output grab position so it can be displayed by the caller
        float grab_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, *v, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        if (axis == ImGuiAxis_Y)
            grab_t = 1.0f - grab_t;
        const float grab_pos = ImLerp(slider_usable_pos_min, slider_usable_pos_max, grab_t);
        if (axis == ImGuiAxis_X)
            *out_grab_bb = ImRect(grab_pos - grab_sz * 0.5f, bb.Min.y + grab_padding, grab_pos + grab_sz * 0.5f, bb.Max.y - grab_padding);
        else
            *out_grab_bb = ImRect(bb.Min.x + grab_padding, grab_pos - grab_sz * 0.5f, bb.Max.x - grab_padding, grab_pos + grab_sz * 0.5f);
    }

    return value_changed;
}